

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

Gia_Man_t * Abc_FrameGetGia(Abc_Frame_t *pAbc)

{
  Gia_Man_t *pGVar1;
  
  if (pAbc->pGia2 != (Gia_Man_t *)0x0) {
    Gia_ManStop(pAbc->pGia2);
  }
  pGVar1 = pAbc->pGia;
  pAbc->pGia = (Gia_Man_t *)0x0;
  pAbc->pGia2 = (Gia_Man_t *)0x0;
  return pGVar1;
}

Assistant:

Gia_Man_t * Abc_FrameGetGia( Abc_Frame_t * pAbc )
{
    Gia_Man_t * pGia;
    if ( pAbc->pGia2 )
        Gia_ManStop( pAbc->pGia2 );
    pAbc->pGia2 = NULL;
    pGia = pAbc->pGia;
    pAbc->pGia = NULL;
    return pGia;
}